

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lvm.c
# Opt level: O0

void luaV_arith(lua_State *L,StkId ra,TValue *rb,TValue *rc,TMS op)

{
  int iVar1;
  TValue *pTVar2;
  TValue *pTVar3;
  lua_Number lVar4;
  TValue *io;
  lua_Number res;
  TValue *c;
  TValue *b;
  TValue tempc;
  TValue tempb;
  TMS op_local;
  TValue *rc_local;
  TValue *rb_local;
  StkId ra_local;
  lua_State *L_local;
  
  pTVar2 = luaV_tonumber(rb,(TValue *)&tempc.tt_);
  if ((pTVar2 == (TValue *)0x0) ||
     (pTVar3 = luaV_tonumber(rc,(TValue *)&b), pTVar3 == (TValue *)0x0)) {
    iVar1 = call_binTM(L,rb,rc,ra,op);
    if (iVar1 == 0) {
      luaG_aritherror(L,rb,rc);
    }
  }
  else {
    lVar4 = luaO_arith(op - TM_ADD,(pTVar2->value_).n,(pTVar3->value_).n);
    (ra->value_).n = lVar4;
    ra->tt_ = 3;
  }
  return;
}

Assistant:

void luaV_arith (lua_State *L, StkId ra, const TValue *rb,
                 const TValue *rc, TMS op) {
  TValue tempb, tempc;
  const TValue *b, *c;
  if ((b = luaV_tonumber(rb, &tempb)) != NULL &&
      (c = luaV_tonumber(rc, &tempc)) != NULL) {
    lua_Number res = luaO_arith(op - TM_ADD + LUA_OPADD, nvalue(b), nvalue(c));
    setnvalue(ra, res);
  }
  else if (!call_binTM(L, rb, rc, ra, op))
    luaG_aritherror(L, rb, rc);
}